

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

void __thiscall miniros::TransportTCP::parseHeader(TransportTCP *this,Header *header)

{
  undefined1 uVar1;
  LogLocation *in_RSI;
  string *in_RDI;
  bool enabled;
  string nodelay;
  char *in_stack_ffffffffffffff28;
  Level level;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  string *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  byte bVar2;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff57;
  LogLocation *loc;
  char *__s;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  allocator<char> in_stack_ffffffffffffff77;
  string local_88 [55];
  allocator<char> in_stack_ffffffffffffffaf;
  TransportTCP *in_stack_ffffffffffffffb0;
  string local_30 [32];
  LogLocation *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  __s = &stack0xffffffffffffffaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),__s,
             (allocator<char> *)local_10);
  uVar1 = Header::getValue((Header *)in_RDI,
                           (string *)
                           CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,
                                             CONCAT15(in_stack_ffffffffffffff55,
                                                      CONCAT14(in_stack_ffffffffffffff54,
                                                               in_stack_ffffffffffffff50)))),
                           in_stack_ffffffffffffff48);
  bVar2 = false;
  loc = local_10;
  if ((bool)uVar1) {
    in_stack_ffffffffffffff55 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff28);
    bVar2 = in_stack_ffffffffffffff55;
    loc = local_10;
  }
  level = (Level)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  uVar3 = bVar2;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  if ((bVar2 & 1) != 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((parseHeader::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff77,
                          CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),__s,
                 (allocator<char> *)loc);
      console::initializeLogLocation
                (loc,in_RDI,
                 CONCAT13(uVar1,CONCAT12(uVar3,CONCAT11(in_stack_ffffffffffffff55,bVar2))));
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    }
    if (parseHeader::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),level)
      ;
      console::checkLogLocationEnabled
                ((LogLocation *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    }
    if ((parseHeader::loc.logger_enabled_ & 1U) != 0) {
      console::print((FilterBase *)0x0,parseHeader::loc.logger_,
                     (Level)(ulong)parseHeader::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0xa5,"virtual void miniros::TransportTCP::parseHeader(const Header &)",
                     "Setting nodelay on socket [%d]",*(undefined4 *)((long)&in_RDI[4].field_2 + 8))
      ;
    }
    setNoDelay(in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void TransportTCP::parseHeader(const Header& header)
{
  std::string nodelay;
  if (header.getValue("tcp_nodelay", nodelay) && nodelay == "1")
  {
    MINIROS_DEBUG("Setting nodelay on socket [%d]", sock_);
    setNoDelay(true);
  }
}